

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::rem_anchor_ref(Tree *this,size_t node)

{
  NodeData *pNVar1;
  type_bits in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_00000038;
  Tree *in_stack_00000040;
  
  pNVar1 = _p(in_stack_00000040,in_stack_00000038);
  basic_substring<const_char>::clear(&(pNVar1->m_key).anchor);
  pNVar1 = _p(in_stack_00000040,in_stack_00000038);
  basic_substring<const_char>::clear(&(pNVar1->m_val).anchor);
  _rem_flags((Tree *)node,unaff_retaddr,in_RDI);
  return;
}

Assistant:

void rem_anchor_ref(size_t node) { _p(node)->m_key.anchor.clear(); _p(node)->m_val.anchor.clear(); _rem_flags(node, KEYANCH|VALANCH|KEYREF|VALREF); }